

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.h
# Opt level: O2

int __thiscall EqGrNode::get_seqsup(EqGrNode *this,int idx,int clas)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int sum;
  int i;
  size_type __n;
  
  if (clas != -1) {
    pvVar3 = std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>::at
                       ((this->_seq_sup).
                        super___shared_ptr<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(long)clas);
    iVar1 = Array::operator[]((pvVar3->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              ,idx);
    return iVar1;
  }
  iVar1 = 0;
  for (__n = 0; (long)__n < (long)this->num_class; __n = __n + 1) {
    pvVar3 = std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>::at
                       ((this->_seq_sup).
                        super___shared_ptr<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,__n);
    iVar2 = Array::operator[]((pvVar3->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              ,idx);
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

int get_seqsup(int idx, int clas = -1) {
        if (clas == -1) {
            int sum = 0;
            //return sup in all classes
            for (int i = 0; i < num_class; i++)
                sum += (*_seq_sup->at(i))[idx];
            return sum;
        } else return (*_seq_sup->at(clas))[idx]; //return sup in class only
    }